

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

iterator __thiscall
phmap::priv::
btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
::upper_bound<phmap::priv::(anonymous_namespace)::StringLike>
          (btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
           *this,StringLike *key)

{
  iterator iVar1;
  iterator iVar2;
  iterator iter;
  StringLike *key_local;
  btree<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
  *this_local;
  
  iVar1 = internal_upper_bound<phmap::priv::(anonymous_namespace)::StringLike>(this,key);
  iter._12_4_ = 0;
  iter.node = (btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
               *)SUB128(iVar1._0_12_,0);
  iter.position = SUB124(iVar1._0_12_,8);
  iVar1 = internal_end(this,iter);
  iVar2._12_4_ = 0;
  iVar2.node = (btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
                *)SUB128(iVar1._0_12_,0);
  iVar2.position = SUB124(iVar1._0_12_,8);
  return iVar2;
}

Assistant:

iterator upper_bound(const K &key) {
            return internal_end(internal_upper_bound(key));
        }